

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark_disks.cpp
# Opt level: O1

int benchmark_disks_alloc<foxxll::striping>
              (external_size_type size,external_size_type start_offset,size_t batch_size,
              size_t raw_block_size,string *optrw)

{
  long lVar1;
  undefined8 *puVar2;
  ulong uVar3;
  ulong *puVar4;
  BID *b;
  instance_pointer piVar5;
  long *plVar6;
  uint *puVar7;
  pointer pBVar8;
  instance_pointer this;
  ostream *poVar9;
  long lVar10;
  char *pcVar11;
  size_t sVar12;
  int iVar13;
  CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter> *pCVar14;
  long *plVar15;
  long lVar16;
  CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter> *pCVar17;
  ulong uVar18;
  tlx *ptVar19;
  tlx *ptVar20;
  char *__s;
  ulong uVar21;
  double dVar22;
  undefined4 uVar25;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  vector<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_> bids;
  vector<unsigned_int_*,_std::allocator<unsigned_int_*>_> buffer;
  striping alloc;
  stringstream ss;
  double local_4b8;
  double local_4b0;
  tlx *local_4a0;
  tlx *local_498;
  tlx *local_490;
  long *local_488;
  long local_478;
  long lStack_470;
  vector<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_> local_468;
  ulong local_448;
  double local_440;
  tlx *local_438;
  tlx *local_430;
  vector<unsigned_int_*,_std::allocator<unsigned_int_*>_> local_428;
  external_size_type local_410;
  tlx *local_408;
  long *local_400;
  long local_3f8;
  long local_3f0;
  long lStack_3e8;
  striping local_3e0;
  long local_3d0 [2];
  ulong *local_3c0;
  string *local_3b8;
  double local_3b0;
  long local_3a8;
  long local_3a0;
  long *local_398 [2];
  long local_388 [2];
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_340;
  undefined1 local_338 [16];
  long local_328 [14];
  ios_base local_2b8 [264];
  char *local_1b0;
  undefined1 local_1a8 [16];
  request local_198 [3];
  
  local_438 = (tlx *)-(ulong)(size == 0);
  local_430 = (tlx *)start_offset;
  local_410 = size;
  local_3a8 = std::__cxx11::string::find((char)optrw,0x72);
  local_3b8 = optrw;
  local_3a0 = std::__cxx11::string::find((char)optrw,0x77);
  if (foxxll::singleton<foxxll::block_manager,true>::instance_ == (block_manager *)0x0) {
    foxxll::singleton<foxxll::block_manager,_true>::create_instance<foxxll::block_manager>();
  }
  if (batch_size == 0) {
    piVar5 = foxxll::singleton<foxxll::config,true>::instance_;
    if (foxxll::singleton<foxxll::config,true>::instance_ == (instance_pointer)0x0) {
      piVar5 = foxxll::singleton<foxxll::config,_true>::create_instance<foxxll::config>();
    }
    if (piVar5->is_initialized == false) {
      (*piVar5->_vptr_config[3])(piVar5);
    }
    batch_size = ((long)(piVar5->disks_list).
                        super__Vector_base<foxxll::disk_config,_std::allocator<foxxll::disk_config>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(piVar5->disks_list).
                        super__Vector_base<foxxll::disk_config,_std::allocator<foxxll::disk_config>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5;
  }
  uVar18 = ((batch_size * raw_block_size) / raw_block_size + 1) -
           (ulong)((batch_size * raw_block_size) % raw_block_size == 0);
  std::vector<unsigned_int_*,_std::allocator<unsigned_int_*>_>::vector
            (&local_428,uVar18,(allocator_type *)local_338);
  pCVar14 = (CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter> *)(uVar18 * 8 + 8);
  pCVar17 = (CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter> *)0xffffffffffffffff;
  if (uVar18 * 8 < 0xfffffffffffffff8) {
    pCVar17 = pCVar14;
  }
  local_3c0 = (ulong *)operator_new__(-(ulong)(uVar18 >> 0x3d != 0) | (ulong)pCVar17);
  *local_3c0 = uVar18;
  pCVar17 = (CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter> *)(local_3c0 + 1);
  if (uVar18 != 0) {
    pCVar14 = pCVar17;
    do {
      pCVar14->ptr_ = (request *)0x0;
      pCVar14 = pCVar14 + 1;
    } while (pCVar14 != pCVar17 + uVar18);
  }
  iVar13 = (int)pCVar14;
  local_468.super__Vector_base<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>._M_impl.
  super__Vector_impl_data._M_start = (BID<0UL> *)0x0;
  local_468.super__Vector_base<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (BID<0UL> *)0x0;
  local_468.super__Vector_base<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tlx::Logger::Logger((Logger *)local_338);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_338,"# Batch size: ",0xe);
  local_3e0.begin_ = (size_t)local_3d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e0,"B","");
  local_408 = (tlx *)(uVar18 * raw_block_size);
  tlx::format_iec_units_abi_cxx11_((string *)local_1a8,local_408,3,iVar13);
  plVar6 = (long *)std::__cxx11::string::_M_append(local_1a8,local_3e0.begin_);
  local_488 = &local_478;
  plVar15 = plVar6 + 2;
  if ((long *)*plVar6 == plVar15) {
    local_478 = *plVar15;
    lStack_470 = plVar6[3];
  }
  else {
    local_478 = *plVar15;
    local_488 = (long *)*plVar6;
  }
  lVar1 = plVar6[1];
  *plVar6 = (long)plVar15;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if ((request *)local_1a8._0_8_ != local_198) {
    operator_delete((void *)local_1a8._0_8_,local_198[0]._0_8_ + 1);
  }
  iVar13 = (int)plVar15;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_338,(char *)local_488,lVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_338," (",2);
  std::ostream::_M_insert<unsigned_long>((ulong)local_338);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_338," blocks of ",0xb);
  local_398[0] = local_388;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_398,"B","");
  tlx::format_iec_units_abi_cxx11_((string *)local_1a8,(tlx *)raw_block_size,3,iVar13);
  plVar6 = (long *)std::__cxx11::string::_M_append(local_1a8,(ulong)local_398[0]);
  plVar15 = plVar6 + 2;
  if ((long *)*plVar6 == plVar15) {
    local_3f0 = *plVar15;
    lStack_3e8 = plVar6[3];
    local_400 = &local_3f0;
  }
  else {
    local_3f0 = *plVar15;
    local_400 = (long *)*plVar6;
  }
  local_3f8 = plVar6[1];
  *plVar6 = (long)plVar15;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if ((request *)local_1a8._0_8_ != local_198) {
    operator_delete((void *)local_1a8._0_8_,local_198[0]._0_8_ + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_338,(char *)local_400,local_3f8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_338,")",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_338," using ",7);
  foxxll::striping::striping((striping *)local_1a8);
  local_1b0 = "striping";
  tlx::LoggerFormatter<const_char_*,_void>::print((ostream *)local_338,&local_1b0);
  if (local_400 != &local_3f0) {
    operator_delete(local_400,local_3f0 + 1);
  }
  if (local_398[0] != local_388) {
    operator_delete(local_398[0],local_388[0] + 1);
  }
  if (local_488 != &local_478) {
    operator_delete(local_488,local_478 + 1);
  }
  if ((long *)local_3e0.begin_ != local_3d0) {
    operator_delete((void *)local_3e0.begin_,local_3d0[0] + 1);
  }
  tlx::Logger::~Logger((Logger *)local_338);
  local_448 = uVar18;
  if (uVar18 != 0) {
    uVar18 = 0;
    do {
      puVar7 = (uint *)foxxll::aligned_alloc<4096ul>(raw_block_size,0);
      local_428.super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>._M_impl.
      super__Vector_impl_data._M_start[uVar18] = puVar7;
      uVar18 = uVar18 + 1;
    } while (uVar18 < local_448);
    lVar16 = 0;
    uVar18 = 0;
    do {
      if (3 < raw_block_size) {
        puVar7 = local_428.super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar18];
        uVar21 = 0;
        do {
          puVar7[uVar21] = (int)lVar16 + (int)uVar21;
          uVar21 = uVar21 + 1;
        } while (raw_block_size >> 2 != uVar21);
      }
      uVar18 = uVar18 + 1;
      lVar16 = lVar16 + (raw_block_size >> 2);
    } while (uVar18 < local_448);
  }
  foxxll::striping::striping(&local_3e0);
  ptVar19 = (tlx *)((ulong)local_438 | (ulong)(local_430 + local_410));
  lVar16 = std::chrono::_V2::steady_clock::now();
  local_498 = (tlx *)0x0;
  if (ptVar19 == (tlx *)0x0) {
    local_4b0 = 0.0;
    local_4a0 = (tlx *)0x0;
    local_4b8 = 0.0;
  }
  else {
    local_3b0 = (double)(lVar16 / 1000) / 1000000.0;
    local_4b8 = 0.0;
    local_4b0 = 0.0;
    local_4a0 = (tlx *)0x0;
    local_490 = (tlx *)0x0;
    local_438 = ptVar19;
    do {
      ptVar19 = local_438;
      std::__cxx11::stringstream::stringstream((stringstream *)local_338);
      ptVar20 = ptVar19 + -(long)local_490;
      if (local_408 <= ptVar19 + -(long)local_490) {
        ptVar20 = local_408;
      }
      uVar18 = ((ulong)ptVar20 / raw_block_size + 1) - (ulong)((ulong)ptVar20 % raw_block_size == 0)
      ;
      lVar16 = (long)local_468.
                     super__Vector_base<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_468.
                     super__Vector_base<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>.
                     _M_impl.super__Vector_impl_data._M_start;
      std::vector<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>::resize
                (&local_468,(lVar16 >> 3) * -0x5555555555555555 + uVar18);
      for (pBVar8 = local_468.
                    super__Vector_base<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>._M_impl
                    .super__Vector_impl_data._M_start;
          pBVar8 != local_468.
                    super__Vector_base<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>._M_impl
                    .super__Vector_impl_data._M_finish; pBVar8 = pBVar8 + 1) {
        pBVar8->size = raw_block_size;
      }
      this = foxxll::singleton<foxxll::block_manager,true>::instance_;
      if (foxxll::singleton<foxxll::block_manager,true>::instance_ == (block_manager *)0x0) {
        this = foxxll::singleton<foxxll::block_manager,_true>::
               create_instance<foxxll::block_manager>();
      }
      foxxll::block_manager::
      new_blocks<foxxll::striping,__gnu_cxx::__normal_iterator<foxxll::BID<0ul>*,std::vector<foxxll::BID<0ul>,std::allocator<foxxll::BID<0ul>>>>>
                (this,&local_3e0,
                 (BID<0UL> *)
                 ((long)local_468.
                        super__Vector_base<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>.
                        _M_impl.super__Vector_impl_data._M_start + lVar16),
                 (__normal_iterator<foxxll::BID<0UL>_*,_std::vector<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>_>
                  )local_468.
                   super__Vector_base<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>._M_impl.
                   super__Vector_impl_data._M_finish,0);
      iVar13 = 0xd;
      if (local_430 <= local_490) {
        if (g_quiet == false) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328,"Offset    ",10);
          *(undefined8 *)((long)local_328 + *(long *)(local_328[0] + -0x18) + 0x10) = 7;
          poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)local_328);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9," MiB: ",6);
          *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) =
               *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) & 0xfffffefb | 4;
        }
        lVar10 = std::chrono::_V2::steady_clock::now();
        dVar22 = (double)(lVar10 / 1000) / 1000000.0;
        if (local_3a0 == -1) {
          dVar22 = 0.0;
        }
        else {
          local_440 = dVar22;
          if (uVar18 != 0) {
            uVar21 = 0;
            do {
              local_358 = 0;
              uStack_350 = 0;
              local_348 = 0;
              p_Stack_340 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              plVar6 = *(long **)((long)local_468.
                                        super__Vector_base<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start +
                                 uVar21 * 0x18 + lVar16);
              (**(code **)(*plVar6 + 8))
                        (local_1a8,plVar6,
                         local_428.
                         super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>._M_impl
                         .super__Vector_impl_data._M_start[uVar21],
                         *(undefined8 *)
                          ((long)local_468.
                                 super__Vector_base<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start +
                          uVar21 * 0x18 + lVar16 + 8),raw_block_size,&local_358);
              if (pCVar17[uVar21].ptr_ != (request *)local_1a8._0_8_) {
                tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>::dec_reference
                          (pCVar17 + uVar21);
                pCVar17[uVar21].ptr_ = (request *)local_1a8._0_8_;
                local_1a8._0_8_ = (request *)0x0;
              }
              tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>::dec_reference
                        ((CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter> *)local_1a8);
              if (p_Stack_340 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_340);
              }
              uVar21 = uVar21 + 1;
            } while (uVar21 < uVar18);
          }
          foxxll::wait_all<tlx::CountingPtr<foxxll::request,tlx::CountingPtrDefaultDeleter>*>
                    (pCVar17,pCVar17 + uVar18);
          lVar10 = std::chrono::_V2::steady_clock::now();
          dVar22 = (double)(lVar10 / 1000) / 1000000.0 - local_440;
          local_498 = local_498 + (long)ptVar20;
          local_4b0 = local_4b0 + dVar22;
        }
        uVar25 = (undefined4)((ulong)ptVar20 >> 0x20);
        if (g_quiet == false) {
          *(undefined8 *)((long)local_328 + *(long *)(local_328[0] + -0x18) + 0x10) = 5;
          *(undefined8 *)((long)local_328 + *(long *)(local_328[0] + -0x18) + 8) = 1;
          auVar23._8_4_ = uVar25;
          auVar23._0_8_ = ptVar20;
          auVar23._12_4_ = 0x45300000;
          poVar9 = std::ostream::_M_insert<double>
                             ((((auVar23._8_8_ - 1.9342813113834067e+25) +
                               ((double)CONCAT44(0x43300000,(int)ptVar20) - 4503599627370496.0)) *
                              9.5367431640625e-07) / dVar22);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9," MiB/s write, ",0xe);
        }
        lVar10 = std::chrono::_V2::steady_clock::now();
        dVar22 = (double)(lVar10 / 1000) / 1000000.0;
        if (local_3a8 == -1) {
          dVar22 = 0.0;
        }
        else {
          local_440 = dVar22;
          if (uVar18 != 0) {
            uVar21 = 0;
            do {
              local_378 = 0;
              uStack_370 = 0;
              local_368 = 0;
              p_Stack_360 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              puVar2 = *(undefined8 **)
                        ((long)local_468.
                               super__Vector_base<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + uVar21 * 0x18 + lVar16);
              (**(code **)*puVar2)
                        (local_1a8,puVar2,
                         local_428.
                         super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>._M_impl
                         .super__Vector_impl_data._M_start[uVar21],
                         *(undefined8 *)
                          ((long)local_468.
                                 super__Vector_base<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start +
                          uVar21 * 0x18 + lVar16 + 8),raw_block_size,&local_378);
              if (pCVar17[uVar21].ptr_ != (request *)local_1a8._0_8_) {
                tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>::dec_reference
                          (pCVar17 + uVar21);
                pCVar17[uVar21].ptr_ = (request *)local_1a8._0_8_;
                local_1a8._0_8_ = (request *)0x0;
              }
              tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>::dec_reference
                        ((CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter> *)local_1a8);
              if (p_Stack_360 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_360);
              }
              uVar21 = uVar21 + 1;
            } while (uVar21 < uVar18);
          }
          foxxll::wait_all<tlx::CountingPtr<foxxll::request,tlx::CountingPtrDefaultDeleter>*>
                    (pCVar17,pCVar17 + uVar18);
          lVar16 = std::chrono::_V2::steady_clock::now();
          dVar22 = (double)(lVar16 / 1000) / 1000000.0 - local_440;
          local_4a0 = local_4a0 + (long)ptVar20;
          local_4b8 = local_4b8 + dVar22;
        }
        if (g_quiet == false) {
          *(undefined8 *)((long)local_328 + *(long *)(local_328[0] + -0x18) + 0x10) = 5;
          *(undefined8 *)((long)local_328 + *(long *)(local_328[0] + -0x18) + 8) = 1;
          auVar24._8_4_ = uVar25;
          auVar24._0_8_ = ptVar20;
          auVar24._12_4_ = 0x45300000;
          poVar9 = std::ostream::_M_insert<double>
                             ((((auVar24._8_8_ - 1.9342813113834067e+25) +
                               ((double)CONCAT44(0x43300000,(int)ptVar20) - 4503599627370496.0)) *
                              9.5367431640625e-07) / dVar22);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9," MiB/s read",0xb);
        }
        if (g_quiet == false) {
          tlx::Logger::Logger((Logger *)local_1a8);
          std::__cxx11::stringbuf::str();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,(char *)local_488,lVar1);
          if (local_488 != &local_478) {
            operator_delete(local_488,local_478 + 1);
          }
          tlx::Logger::~Logger((Logger *)local_1a8);
        }
        lVar16 = std::chrono::_V2::steady_clock::now();
        iVar13 = 0;
        if (g_time_limit < (double)(lVar16 / 1000) / 1000000.0 - local_3b0) {
          iVar13 = 0xb;
        }
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_338);
      std::ios_base::~ios_base(local_2b8);
    } while (((iVar13 == 0xd) || (iVar13 == 0)) &&
            (local_490 = local_490 + (long)ptVar20, local_490 < local_438));
  }
  tlx::Logger::Logger((Logger *)local_338);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_338,
             "=============================================================================================\n"
             ,0x5e);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_338,"# Average over ",0xf);
  *(undefined8 *)((long)local_328 + *(long *)(local_338._0_8_ + -0x18)) = 7;
  std::ostream::_M_insert<unsigned_long>((ulong)local_338);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_338," MiB: ",6);
  *(undefined8 *)((long)local_328 + *(long *)(local_338._0_8_ + -0x18)) = 5;
  *(undefined8 *)(local_338 + *(long *)(local_338._0_8_ + -0x18) + 8) = 1;
  std::ostream::_M_insert<double>
            (((((double)CONCAT44(0x45300000,(int)((ulong)local_498 >> 0x20)) -
               1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)local_498) - 4503599627370496.0)) *
             9.5367431640625e-07) / local_4b0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_338," MiB/s write, ",0xe);
  *(undefined8 *)((long)local_328 + *(long *)(local_338._0_8_ + -0x18)) = 5;
  *(undefined8 *)(local_338 + *(long *)(local_338._0_8_ + -0x18) + 8) = 1;
  std::ostream::_M_insert<double>
            (((((double)CONCAT44(0x45300000,(int)((ulong)local_4a0 >> 0x20)) -
               1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)local_4a0) - 4503599627370496.0)) *
             9.5367431640625e-07) / local_4b8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_338," MiB/s read",0xb);
  tlx::Logger::~Logger((Logger *)local_338);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"RESULT",6);
  pcVar11 = getenv("RESULT");
  __s = "";
  if (pcVar11 != (char *)0x0) {
    __s = pcVar11;
  }
  sVar12 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar12);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," size=",6);
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," op=",4);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,(local_3b8->_M_dataplus)._M_p,local_3b8->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," block_size=",0xc);
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," batch_size=",0xc);
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," offset=",8);
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," write_time=",0xc);
  poVar9 = std::ostream::_M_insert<double>(local_4b0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," read_time=",0xb);
  poVar9 = std::ostream::_M_insert<double>(local_4b8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," write_size=",0xc);
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," read_size=",0xb);
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," time=",6);
  poVar9 = std::ostream::_M_insert<double>(local_4b0 + local_4b8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," total_size=",0xc);
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  puVar4 = local_3c0;
  uVar18 = *local_3c0 * 8;
  uVar21 = uVar18;
  uVar3 = *local_3c0;
  while (uVar3 != 0) {
    tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>::dec_reference
              ((CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter> *)
               ((long)puVar4 + uVar21));
    uVar21 = uVar21 - 8;
    uVar3 = uVar21;
  }
  operator_delete__(puVar4,uVar18 + 8);
  if (local_448 != 0) {
    uVar18 = 0;
    do {
      if (local_428.super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>._M_impl.
          super__Vector_impl_data._M_start[uVar18] != (uint *)0x0) {
        free(*(void **)(local_428.
                        super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar18] + -2));
      }
      uVar18 = uVar18 + 1;
    } while (uVar18 < local_448);
  }
  if (local_468.super__Vector_base<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>._M_impl.
      super__Vector_impl_data._M_start != (BID<0UL> *)0x0) {
    operator_delete(local_468.
                    super__Vector_base<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_468.
                          super__Vector_base<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_468.
                          super__Vector_base<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_428.super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_428.super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_428.
                          super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_428.
                          super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int benchmark_disks_alloc(
    external_size_type size, external_size_type start_offset,
    size_t batch_size, const size_t raw_block_size,
    const std::string& optrw)
{
    external_size_type endpos = start_offset + size;

    if (size == 0)
        endpos = std::numeric_limits<external_size_type>::max();

    bool do_read = (optrw.find('r') != std::string::npos);
    bool do_write = (optrw.find('w') != std::string::npos);

    // initialize disk configuration
    foxxll::block_manager::get_instance();

    // construct block type

    const size_t block_size = raw_block_size / sizeof(uint32_t);

    using block_type = uint32_t *;
    using BID = foxxll::BID<0>;

    if (batch_size == 0)
        batch_size = foxxll::config::get_instance()->disks_number();

    // calculate total bytes processed in a batch
    batch_size = raw_block_size * batch_size;

    size_t num_blocks_per_batch = foxxll::div_ceil(batch_size, raw_block_size);
    batch_size = num_blocks_per_batch * raw_block_size;

    std::vector<block_type> buffer(num_blocks_per_batch);
    foxxll::request_ptr* reqs = new foxxll::request_ptr[num_blocks_per_batch];
    std::vector<BID> bids;
    double total_time_read = 0, total_time_write = 0;
    external_size_type total_size_read = 0, total_size_write = 0;

    LOG1 << "# Batch size: "
         << foxxll::add_IEC_binary_multiplier(batch_size, "B") << " ("
         << num_blocks_per_batch << " blocks of "
         << foxxll::add_IEC_binary_multiplier(raw_block_size, "B") << ")"
         << " using " << AllocStrategy().name();

    // allocate data blocks
    for (size_t j = 0; j < num_blocks_per_batch; ++j) {
        buffer[j] = reinterpret_cast<block_type>(
                foxxll::aligned_alloc<4096>(raw_block_size));
    }

    // touch data, so it is actually allocated
    for (size_t j = 0; j < num_blocks_per_batch; ++j) {
        for (size_t i = 0; i < block_size; ++i)
            buffer[j][i] = static_cast<uint32_t>(j * block_size + i);
    }

    try {
        AllocStrategy alloc;
        size_t current_batch_size;

        double ts_begin = timestamp();

        for (external_size_type offset = 0; offset < endpos; offset += current_batch_size)
        {
            std::stringstream ss;

            current_batch_size = static_cast<size_t>(
                    std::min<external_size_type>(batch_size, endpos - offset));
#if CHECK_AFTER_READ
            const size_t current_batch_size_int = current_batch_size / sizeof(uint32_t);
#endif
            const size_t current_num_blocks_per_batch =
                foxxll::div_ceil(current_batch_size, raw_block_size);

            size_t num_total_blocks = bids.size();
            bids.resize(num_total_blocks + current_num_blocks_per_batch);

            // fill in block size of BID<0> variable blocks
            for (BID& b : bids) b.size = raw_block_size;

            foxxll::block_manager::get_instance()->new_blocks(
                alloc, bids.begin() + num_total_blocks, bids.end()
            );

            if (offset < start_offset)
                continue;

            if (!g_quiet)
                ss << "Offset    " << std::setw(7) << (offset / MiB) << " MiB: "
                   << std::fixed;

            double begin = timestamp(), end, elapsed;

            if (do_write)
            {
                for (size_t j = 0; j < current_num_blocks_per_batch; j++)
                    reqs[j] = bids[num_total_blocks + j].write(buffer[j], raw_block_size);

                wait_all(reqs, current_num_blocks_per_batch);

                end = timestamp();
                elapsed = end - begin;
                total_size_write += current_batch_size;
                total_time_write += elapsed;
            }
            else
                elapsed = 0.0;

            if (!g_quiet)
                ss << std::setw(5) << std::setprecision(1)
                   << (double(current_batch_size) / MiB / elapsed)
                   << " MiB/s write, ";

            begin = timestamp();

            if (do_read)
            {
                for (size_t j = 0; j < current_num_blocks_per_batch; j++)
                    reqs[j] = bids[num_total_blocks + j].read(
                            buffer[j], raw_block_size
                        );

                wait_all(reqs, current_num_blocks_per_batch);

                end = timestamp();
                elapsed = end - begin;
                total_size_read += current_batch_size;
                total_time_read += elapsed;
            }
            else
                elapsed = 0.0;

            if (!g_quiet)
                ss << std::setw(5) << std::setprecision(1)
                   << (double(current_batch_size) / MiB / elapsed)
                   << " MiB/s read";

            if (!g_quiet)
                LOG1 << ss.str();

#if CHECK_AFTER_READ
            for (size_t j = 0; j < current_num_blocks_per_batch; j++)
            {
                for (size_t i = 0; i < block_size; i++)
                {
                    if (buffer[j][i] != static_cast<uint32_t>(j * block_size + i))
                    {
                        size_t ibuf = i / current_batch_size_int;
                        size_t pos = i % current_batch_size_int;

                        LOG1 << "Error on disk " << ibuf << " position "
                             << std::hex << std::setw(8)
                             << offset + pos * sizeof(uint32_t)
                             << "  got: "
                             << std::hex << std::setw(8)
                             << buffer[j][i]
                             << " wanted: "
                             << std::hex << std::setw(8)
                             << (j * block_size + i)
                             << std::dec << std::endl;

                        i = (ibuf + 1) * current_batch_size_int; // jump to next
                    }
                }
            }
#endif
            if (timestamp() - ts_begin > g_time_limit)
                break;
        }
    }
    catch (const std::exception& ex)
    {
        LOG1 << ex.what();
    }

    LOG1 << "=============================================================================================\n"
         << "# Average over " << std::setw(7) << total_size_write / MiB << " MiB: "
         << std::setw(5) << std::setprecision(1)
         << (double(total_size_write) / MiB / total_time_write) << " MiB/s write, "
         << std::setw(5) << std::setprecision(1)
         << (double(total_size_read) / MiB / total_time_read) << " MiB/s read";

    std::cout << "RESULT"
              << (getenv("RESULT") ? getenv("RESULT") : "")
              << " size=" << size
              << " op=" << optrw
              << " block_size=" << raw_block_size
              << " batch_size=" << batch_size / raw_block_size
              << " offset=" << start_offset
              << " write_time=" << total_time_write
              << " read_time=" << total_time_read
              << " write_size=" << total_size_write
              << " read_size=" << total_size_read
              << " time=" << (total_time_write + total_time_read)
              << " total_size=" << (total_size_write + total_size_read)
              << std::endl;

    delete[] reqs;

    for (size_t j = 0; j < num_blocks_per_batch; ++j)
        foxxll::aligned_dealloc<4096>(buffer[j]);

    return 0;
}